

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmExecutionStatus *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  string *a_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  unsigned_long uVar6;
  char *pcVar7;
  mode_t local_2fc;
  byte local_2ad;
  char *local_2a8;
  char local_299;
  undefined1 local_298 [8];
  string toPath;
  char local_269;
  undefined1 local_268 [8];
  string fromPath;
  unsigned_long fileNum;
  unsigned_long numFiles;
  Directory local_230;
  Directory dir;
  mode_t permissions_after;
  mode_t permissions_before;
  mode_t required_permissions;
  mode_t local_214;
  undefined1 local_210 [4];
  mode_t permissions;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream e;
  Status local_48;
  Status makedir_status;
  mode_t *default_dir_mode;
  string *psStack_30;
  mode_t default_dir_mode_v;
  string *destination_local;
  string *source_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  psStack_30 = destination;
  destination_local = source;
  source_local = (string *)this;
  unique0x1000047e = match_properties;
  bVar1 = cmsys::SystemTools::FileIsDirectory(destination);
  local_2ad = 0;
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsSymlink(psStack_30);
    local_2ad = bVar1 ^ 0xff;
  }
  (*this->_vptr_cmFileCopier[5])(this,destination,1,(ulong)((local_2ad ^ 0xff) & 1));
  default_dir_mode._4_4_ = 0;
  makedir_status = (Status)((long)&default_dir_mode + 4);
  bVar1 = GetDefaultDirectoryPermissions(this,(mode_t **)&makedir_status);
  if (bVar1) {
    local_48 = cmsys::SystemTools::MakeDirectory(psStack_30,(mode_t *)makedir_status);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_48);
    if (bVar1) {
      if (mStack_10 == 0) {
        local_2fc = this->DirPermissions;
      }
      else {
        local_2fc = mStack_10;
      }
      local_214 = local_2fc;
      if (local_2fc == 0) {
        cmsys::SystemTools::GetPermissions(destination_local,&local_214);
      }
      dir.Internal._0_4_ = 0;
      if ((local_214 & 0x1c0) == 0x1c0) {
        dir.Internal._4_4_ = local_214;
      }
      else {
        dir.Internal._4_4_ = local_214 | 0x1c0;
        dir.Internal._0_4_ = local_214;
      }
      bVar1 = SetPermissions(this,psStack_30,dir.Internal._4_4_);
      if (bVar1) {
        cmsys::Directory::Directory(&local_230);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          cmsys::Directory::Load(&local_230,destination_local,(string *)0x0);
        }
        uVar6 = cmsys::Directory::GetNumberOfFiles(&local_230);
        for (fromPath.field_2._8_8_ = 0; (ulong)fromPath.field_2._8_8_ < uVar6;
            fromPath.field_2._8_8_ = fromPath.field_2._8_8_ + 1) {
          pcVar7 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
          iVar2 = strcmp(pcVar7,".");
          if (iVar2 != 0) {
            pcVar7 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
            iVar2 = strcmp(pcVar7,"..");
            a_00 = destination_local;
            if (iVar2 != 0) {
              local_269 = '/';
              toPath.field_2._8_8_ = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
              cmStrCat<std::__cxx11::string_const&,char,char_const*>
                        ((string *)local_268,a_00,&local_269,(char **)((long)&toPath.field_2 + 8));
              a = psStack_30;
              local_299 = '/';
              local_2a8 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
              cmStrCat<std::__cxx11::string_const&,char,char_const*>
                        ((string *)local_298,a,&local_299,&local_2a8);
              uVar3 = (*this->_vptr_cmFileCopier[3])(this,local_268,local_298);
              bVar1 = (uVar3 & 1) == 0;
              if (bVar1) {
                match_properties_local._3_1_ = 0;
              }
              std::__cxx11::string::~string((string *)local_298);
              std::__cxx11::string::~string((string *)local_268);
              if (bVar1) goto LAB_006a1093;
            }
          }
        }
        match_properties_local._3_1_ = SetPermissions(this,psStack_30,(mode_t)dir.Internal);
LAB_006a1093:
        cmsys::Directory::~Directory(&local_230);
      }
      else {
        match_properties_local._3_1_ = 0;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar4 = std::operator<<((ostream *)local_1c0,this->Name);
      poVar4 = std::operator<<(poVar4," cannot make directory \"");
      poVar4 = std::operator<<(poVar4,(string *)psStack_30);
      poVar4 = std::operator<<(poVar4,"\": ");
      cmsys::Status::GetString_abi_cxx11_(&local_1f0,&local_48);
      poVar4 = std::operator<<(poVar4,(string *)&local_1f0);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string((string *)&local_1f0);
      this_00 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(this_00,(string *)local_210);
      std::__cxx11::string::~string((string *)local_210);
      match_properties_local._3_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
  }
  else {
    match_properties_local._3_1_ = 0;
  }
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  auto makedir_status =
    cmSystemTools::MakeDirectory(destination, default_dir_mode);
  if (!makedir_status) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << makedir_status.GetString() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}